

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpControl.cpp
# Opt level: O0

void * gpControlThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char local_cb8 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_ab0;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  undefined1 local_a58 [4];
  BOOL bConnected;
  GPCONTROL gpcontrol;
  void *pParam_local;
  
  chrono_period._68_4_ = 0;
  i = 100;
  local_ab0 = 0;
  gpcontrol._2624_8_ = pParam;
  memset(local_a58,0,0xa48);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)i);
      if (bPausegpControl == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("gpControl Paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectgpControl((GPCONTROL *)local_a58);
      }
      if (bExit != 0) goto LAB_0016a7e0;
      mSleep(100);
    }
    if (bRestartgpControl != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a gpControl.\n");
        chrono_period._68_4_ = 0;
        DisconnectgpControl((GPCONTROL *)local_a58);
      }
      bRestartgpControl = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectgpControl((GPCONTROL *)local_a58,"gpControl0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i._0_1_ = gpcontrol.szDevPath[0xf8];
        i._1_1_ = gpcontrol.szDevPath[0xf9];
        i._2_1_ = gpcontrol.szDevPath[0xfa];
        i._3_1_ = gpcontrol.szDevPath[0xfb];
        if (gpcontrol._792_8_ != 0) {
          fclose((FILE *)gpcontrol._792_8_);
          gpcontrol.tcpsock = 0;
          gpcontrol._796_4_ = 0;
        }
        if ((gpcontrol.szDevPath._252_4_ != 0) && (gpcontrol._792_8_ == 0)) {
          sVar2 = strlen((char *)&gpcontrol.pfSaveFile);
          if (sVar2 == 0) {
            sprintf(local_cb8,"gpcontrol");
          }
          else {
            sprintf(local_cb8,"%.127s",&gpcontrol.pfSaveFile);
          }
          sVar2 = strlen(local_cb8);
          szSaveFilePath._252_4_ = (undefined4)sVar2;
          do {
            szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + -1;
            if ((int)szSaveFilePath._252_4_ < 0) break;
          } while (local_cb8[(int)szSaveFilePath._252_4_] != '.');
          if ((0 < (int)szSaveFilePath._252_4_) &&
             (sVar2 = strlen(local_cb8), (int)szSaveFilePath._252_4_ < (int)sVar2)) {
            sVar2 = strlen(local_cb8);
            memset(local_cb8 + (int)szSaveFilePath._252_4_,0,
                   sVar2 - (long)(int)szSaveFilePath._252_4_);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.csv",local_cb8,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          gpcontrol._792_8_ = fopen(szTemp + 0xf8,"w");
          if ((FILE *)gpcontrol._792_8_ == (FILE *)0x0) {
            printf("Unable to create gpControl data file.\n");
            goto LAB_0016a7e0;
          }
          fprintf((FILE *)gpcontrol._792_8_,"tv_sec;tv_usec;val;\n");
          fflush((FILE *)gpcontrol._792_8_);
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar1 = KeepAlivegpControl((GPCONTROL *)local_a58);
      if (iVar1 != 0) {
        printf("Connection to a gpControl lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectgpControl((GPCONTROL *)local_a58);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_ab0 = local_ab0 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_ab0)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_0016a7e0:
      StopChronoQuick((CHRONO *)&errcount);
      if (gpcontrol._792_8_ != 0) {
        fclose((FILE *)gpcontrol._792_8_);
        gpcontrol.tcpsock = 0;
        gpcontrol._796_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectgpControl((GPCONTROL *)local_a58);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE gpControlThread(void* pParam)
{
	GPCONTROL gpcontrol;
	//struct timeval tv;
	//double val = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&gpcontrol, 0, sizeof(GPCONTROL));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPausegpControl)
		{
			if (bConnected)
			{
				printf("gpControl Paused.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartgpControl)
		{
			if (bConnected)
			{
				printf("Restarting a gpControl.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}
			bRestartgpControl = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectgpControl(&gpcontrol, "gpControl0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = gpcontrol.threadperiod;

				if (gpcontrol.pfSaveFile != NULL)
				{
					fclose(gpcontrol.pfSaveFile); 
					gpcontrol.pfSaveFile = NULL;
				}
				if ((gpcontrol.bSaveRawData)&&(gpcontrol.pfSaveFile == NULL)) 
				{
					if (strlen(gpcontrol.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", gpcontrol.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "gpcontrol");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					gpcontrol.pfSaveFile = fopen(szSaveFilePath, "w");
					if (gpcontrol.pfSaveFile == NULL) 
					{
						printf("Unable to create gpControl data file.\n");
						break;
					}
					fprintf(gpcontrol.pfSaveFile, "tv_sec;tv_usec;val;\n"); 
					fflush(gpcontrol.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (KeepAlivegpControl(&gpcontrol) == EXIT_SUCCESS)
			{
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				//EnterCriticalSection(&StateVariablesCS);


				//LeaveCriticalSection(&StateVariablesCS);

				//if (gpcontrol.bSaveRawData)
				//{
				//	fprintf(gpcontrol.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, val);
				//	fflush(gpcontrol.pfSaveFile);
				//}
			}
			else
			{
				printf("Connection to a gpControl lost.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}		
		}

		//printf("gpControlThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (gpcontrol.pfSaveFile != NULL)
	{
		fclose(gpcontrol.pfSaveFile); 
		gpcontrol.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectgpControl(&gpcontrol);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}